

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::read_response(cgi_forwarder *this)

{
  element_type *d;
  callback<void_()> *in_RDI;
  enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder> *in_stack_ffffffffffffff38;
  mutable_buffer *this_00;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *in_stack_ffffffffffffff68;
  offset_in_cgi_forwarder_to_subr in_stack_ffffffffffffff70;
  callback local_78 [64];
  code *local_38;
  undefined8 local_30;
  undefined1 local_10 [16];
  
  d = std::
      __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3827c5);
  std::enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder>::shared_from_this
            (in_stack_ffffffffffffff38);
  local_38 = cleanup;
  local_30 = 0;
  mfunc_to_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  booster::callback<void()>::callback<booster::callable<void()>>
            (in_RDI,(intrusive_ptr<booster::callable<void_()>_> *)in_stack_ffffffffffffff38);
  (*d->_vptr_connection[0x13])(d,local_10);
  booster::callback<void_()>::~callback((callback<void_()> *)0x38285f);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&in_RDI->call_ptr);
  std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x382879);
  this_00 = (mutable_buffer *)(in_RDI + 4);
  booster::aio::buffer((vector<char,_std::allocator<char>_> *)d);
  std::enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder>::shared_from_this
            ((enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder> *)this_00);
  mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  booster::callback<void(std::error_code_const&,unsigned_long)>::
  callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI,
             (intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *)
             this_00);
  booster::aio::stream_socket::async_read_some(this_00,local_78);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x38290b);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *
                 )in_RDI);
  std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x38291f);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x382929);
  return;
}

Assistant:

void read_response() 
		{
			conn_->async_read_eof(mfunc_to_handler(&cgi_forwarder::cleanup,shared_from_this()));
			scgi_.async_read_some(booster::aio::buffer(response_),
						mfunc_to_io_handler(&cgi_forwarder::on_response_read,shared_from_this()));
		}